

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

csp_conn_t * csp_connect(uint8_t prio,uint16_t dest,uint8_t dport,uint32_t timeout,uint32_t opts)

{
  csp_id_t_conflict idout;
  csp_id_t_conflict idin;
  int iVar1;
  uint8_t in_DL;
  undefined2 in_SI;
  undefined1 in_DIL;
  uint in_R8D;
  csp_conn_t *conn;
  csp_id_t_conflict outgoing_id;
  csp_id_t_conflict incoming_id;
  undefined8 in_stack_ffffffffffffffd0;
  csp_conn_type_t type;
  byte bVar2;
  undefined2 uVar3;
  uint8_t in_stack_ffffffffffffffdf;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffe6;
  uint local_18;
  csp_conn_t *local_8;
  
  type = (csp_conn_type_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  local_18 = csp_conf.conn_dfl_so | in_R8D;
  memset(&stack0xffffffffffffffe0,0,8);
  memset(&stack0xffffffffffffffd8,0,8);
  uVar3 = 0;
  bVar4 = 0;
  bVar2 = 0;
  if ((local_18 & 0x80) != 0) {
    local_18 = local_18 & 0xffffffbf;
  }
  if ((local_18 & 1) != 0) {
    bVar4 = 2;
    bVar2 = 2;
  }
  if ((local_18 & 4) != 0) {
    bVar2 = bVar2 | 8;
    bVar4 = bVar4 | 8;
  }
  if ((local_18 & 0x40) != 0) {
    bVar2 = bVar2 | 1;
    bVar4 = bVar4 | 1;
  }
  idin.flags = bVar4;
  idin.pri = in_DIL;
  idin.src = in_SI;
  idin.dst = 0;
  idin.dport = in_stack_ffffffffffffffe6;
  idin.sport = in_DL;
  idout.flags = bVar2;
  idout.pri = in_DIL;
  idout.src = 0;
  idout.dst = in_SI;
  idout.dport = in_DL;
  idout.sport = in_stack_ffffffffffffffdf;
  local_8 = csp_conn_new(idin,idout,type);
  if (local_8 == (csp_conn_t *)0x0) {
    local_8 = (csp_conn_t *)0x0;
  }
  else {
    (local_8->idout).sport = local_8->sport_outgoing;
    (local_8->idin).dport = local_8->sport_outgoing;
    local_8->dest_socket = (csp_socket_t *)0x0;
    local_8->opts = local_18;
    if (((bVar2 & 2) != 0) &&
       (iVar1 = csp_rdp_connect((csp_conn_t *)
                                CONCAT17(in_stack_ffffffffffffffdf,
                                         CONCAT16(in_DL,CONCAT24(in_SI,CONCAT22(uVar3,CONCAT11(bVar2
                                                  ,in_DIL)))))), iVar1 != 0)) {
      csp_close((csp_conn_t *)0x107da6);
      local_8 = (csp_conn_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

csp_conn_t * csp_connect(uint8_t prio, uint16_t dest, uint8_t dport, uint32_t timeout, uint32_t opts) {

	/* Force options on all connections */
	opts |= csp_conf.conn_dfl_so;

	/* Generate identifier */
	csp_id_t incoming_id = {0}, outgoing_id = {0};

	/* Use 0 as incoming id (this disables the input filter on destination node)
	 * This means that for this outgoing connection, we accept the answer coming to whatever address
	 * the outgoing interface has. CSP does not support "source address" on outgoing connections
	 * so the outgoing source address will be automatically applied after outgoing routing
	 * selects which interface the packet will leave from */
	incoming_id.dst = 0;
	outgoing_id.src = 0;

	incoming_id.pri = prio;
	outgoing_id.pri = prio;
	incoming_id.src = dest;
	outgoing_id.dst = dest;
	incoming_id.sport = dport;
	outgoing_id.dport = dport;
	incoming_id.flags = 0;
	outgoing_id.flags = 0;

	/* Set connection options */
	if (opts & CSP_O_NOCRC32) {
		opts &= ~CSP_O_CRC32;
	}

	if (opts & CSP_O_RDP) {
#if (CSP_USE_RDP)
		incoming_id.flags |= CSP_FRDP;
		outgoing_id.flags |= CSP_FRDP;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		return NULL;
#endif
	}

	if (opts & CSP_O_HMAC) {
#if (CSP_USE_HMAC)
		outgoing_id.flags |= CSP_FHMAC;
		incoming_id.flags |= CSP_FHMAC;
#else
		csp_dbg_errno = CSP_DBG_ERR_UNSUPPORTED;
		return NULL;
#endif
	}

	if (opts & CSP_O_CRC32) {
		outgoing_id.flags |= CSP_FCRC32;
		incoming_id.flags |= CSP_FCRC32;
	}

	/* Find a new connection */
	csp_conn_t * conn = csp_conn_new(incoming_id, outgoing_id, CONN_CLIENT);
	if (conn == NULL) {
		return NULL;
	}

	/* Outgoing connections always use pre-defined source port */
	conn->idout.sport = conn->sport_outgoing;
	conn->idin.dport = conn->sport_outgoing;
	conn->dest_socket = NULL;

	/* Set connection options */
	conn->opts = opts;

#if (CSP_USE_RDP)
	/* Call Transport Layer connect */
	if (outgoing_id.flags & CSP_FRDP) {
		/* If the transport layer has failed to connect
		 * deallocate connection structure again and return NULL */
		if (csp_rdp_connect(conn) != CSP_ERR_NONE) {
			csp_close(conn);
			return NULL;
		}
	}
#endif

	/* We have a successful connection */
	return conn;
}